

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecMan.c
# Opt level: O0

void Cec_ManPatPrintStats(Cec_ManPat_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Cec_ManPat_t *p_local;
  
  uVar1 = p->nPats;
  uVar2 = p->nPatLits;
  uVar3 = p->nPatLitsMin;
  iVar4 = p->nPatLitsMin;
  iVar5 = p->nPats;
  iVar6 = Vec_StrSize(p->vStorage);
  Abc_Print(1,"Latest: P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n",
            ((double)iVar4 * 1.0) / (double)iVar5,((double)(iVar6 - p->iStart) * 1.0) / 1048576.0,
            (ulong)uVar1,(ulong)uVar2,(ulong)uVar3);
  uVar1 = p->nPatsAll;
  uVar2 = p->nPatLitsAll;
  uVar3 = p->nPatLitsMinAll;
  iVar4 = p->nPatLitsMinAll;
  iVar5 = p->nPatsAll;
  iVar6 = Vec_StrSize(p->vStorage);
  Abc_Print(1,"Total:  P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n",
            ((double)iVar4 * 1.0) / (double)iVar5,((double)iVar6 * 1.0) / 1048576.0,(ulong)uVar1,
            (ulong)uVar2,(ulong)uVar3);
  Abc_PrintTimeP(1,"Finding  ",p->timeFind,p->timeTotal);
  Abc_PrintTimeP(1,"Shrinking",p->timeShrink,p->timeTotal);
  Abc_PrintTimeP(1,"Verifying",p->timeVerify,p->timeTotal);
  Abc_PrintTimeP(1,"Sorting  ",p->timeSort,p->timeTotal);
  Abc_PrintTimeP(1,"Packing  ",p->timePack,p->timeTotal);
  Abc_PrintTime(1,"TOTAL    ",p->timeTotal);
  return;
}

Assistant:

void Cec_ManPatPrintStats( Cec_ManPat_t * p )  
{ 
    Abc_Print( 1, "Latest: P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n", 
        p->nPats, p->nPatLits, p->nPatLitsMin, 1.0 * p->nPatLitsMin/p->nPats, 
        1.0*(Vec_StrSize(p->vStorage)-p->iStart)/(1<<20) );
    Abc_Print( 1, "Total:  P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n", 
        p->nPatsAll, p->nPatLitsAll, p->nPatLitsMinAll, 1.0 * p->nPatLitsMinAll/p->nPatsAll, 
        1.0*Vec_StrSize(p->vStorage)/(1<<20) );
    Abc_PrintTimeP( 1, "Finding  ", p->timeFind,   p->timeTotal );
    Abc_PrintTimeP( 1, "Shrinking", p->timeShrink, p->timeTotal );
    Abc_PrintTimeP( 1, "Verifying", p->timeVerify, p->timeTotal );
    Abc_PrintTimeP( 1, "Sorting  ", p->timeSort,   p->timeTotal );
    Abc_PrintTimeP( 1, "Packing  ", p->timePack,   p->timeTotal );
    Abc_PrintTime( 1, "TOTAL    ",  p->timeTotal );
}